

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O3

void Cba_NtkPrintDistribSortOne(Vec_Ptr_t *vTypes,Vec_Ptr_t *vOccurs,int Type)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 *puVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  
  if (((-1 < Type) && (Type < vTypes->nSize)) && (Type < vOccurs->nSize)) {
    pvVar2 = vOccurs->pArray[(uint)Type];
    uVar1 = *(uint *)((long)vTypes->pArray[(uint)Type] + 4);
    uVar8 = (ulong)(int)uVar1;
    lVar3 = *(long *)((long)pvVar2 + 8);
    if (1 < (long)uVar8) {
      lVar4 = *(long *)((long)vTypes->pArray[(uint)Type] + 8);
      uVar10 = 1;
      uVar11 = 0;
      do {
        uVar7 = uVar11 & 0xffffffff;
        uVar12 = uVar10;
        do {
          uVar6 = uVar12 & 0xffffffff;
          if (*(ulong *)(lVar3 + (long)(int)uVar7 * 8) <= *(ulong *)(lVar3 + uVar12 * 8)) {
            uVar6 = uVar7;
          }
          uVar7 = uVar6;
          uVar12 = uVar12 + 1;
        } while (uVar8 != uVar12);
        uVar5 = *(undefined8 *)(lVar4 + uVar11 * 8);
        lVar13 = (long)(int)uVar7;
        *(undefined8 *)(lVar4 + uVar11 * 8) = *(undefined8 *)(lVar4 + lVar13 * 8);
        *(undefined8 *)(lVar4 + lVar13 * 8) = uVar5;
        uVar5 = *(undefined8 *)(lVar3 + uVar11 * 8);
        *(undefined8 *)(lVar3 + uVar11 * 8) = *(undefined8 *)(lVar3 + lVar13 * 8);
        uVar11 = uVar11 + 1;
        *(undefined8 *)(lVar3 + lVar13 * 8) = uVar5;
        uVar10 = uVar10 + 1;
      } while (uVar11 != uVar1 - 1);
      puVar9 = (undefined8 *)(lVar4 + uVar8 * 8);
      uVar8 = 0;
      do {
        puVar9 = puVar9 + -1;
        uVar5 = *(undefined8 *)(lVar4 + uVar8 * 8);
        *(undefined8 *)(lVar4 + uVar8 * 8) = *puVar9;
        *puVar9 = uVar5;
        uVar8 = uVar8 + 1;
      } while (uVar1 >> 1 != uVar8);
    }
    uVar1 = *(uint *)((long)pvVar2 + 4);
    if (1 < (long)(int)uVar1) {
      puVar9 = (undefined8 *)(lVar3 + (long)(int)uVar1 * 8);
      uVar8 = 0;
      do {
        puVar9 = puVar9 + -1;
        uVar5 = *(undefined8 *)(lVar3 + uVar8 * 8);
        *(undefined8 *)(lVar3 + uVar8 * 8) = *puVar9;
        *puVar9 = uVar5;
        uVar8 = uVar8 + 1;
      } while (uVar1 >> 1 != uVar8);
    }
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Cba_NtkPrintDistribSortOne( Vec_Ptr_t * vTypes, Vec_Ptr_t * vOccurs, int Type )
{
    Vec_Wrd_t * vType  = (Vec_Wrd_t *)Vec_PtrEntry( vTypes, Type );
    Vec_Wrd_t * vOccur = (Vec_Wrd_t *)Vec_PtrEntry( vOccurs, Type );
    Vec_WrdSelectSortCost2( Vec_WrdArray(vType), Vec_WrdSize(vType), Vec_WrdArray(vOccur) );
    Vec_WrdReverseOrder( vType );
    Vec_WrdReverseOrder( vOccur );
}